

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O3

int __thiscall HighsLinearSumBounds::remove(HighsLinearSumBounds *this,char *__filename)

{
  int *piVar1;
  pointer piVar2;
  pointer pHVar3;
  double *pdVar4;
  int in_EDX;
  double *pdVar5;
  int iVar6;
  double in_XMM0_Qa;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar6 = (int)__filename;
  if (this->implVarLowerSource[in_EDX] == iVar6) {
    pdVar4 = this->varLower;
    dVar7 = pdVar4[in_EDX];
  }
  else {
    pdVar4 = this->varLower;
    dVar7 = pdVar4[in_EDX];
    if (pdVar4[in_EDX] <= this->implVarLower[in_EDX]) {
      dVar7 = this->implVarLower[in_EDX];
    }
  }
  if (this->implVarUpperSource[in_EDX] == iVar6) {
    pdVar5 = this->varUpper;
    dVar8 = pdVar5[in_EDX];
  }
  else {
    pdVar5 = this->varUpper;
    dVar8 = pdVar5[in_EDX];
    if (this->implVarUpper[in_EDX] <= pdVar5[in_EDX]) {
      dVar8 = this->implVarUpper[in_EDX];
    }
  }
  if (0.0 < in_XMM0_Qa) {
    if (-INFINITY < dVar7) {
      dVar7 = dVar7 * in_XMM0_Qa;
      pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar9 = pHVar3[iVar6].hi;
      dVar10 = dVar9 - dVar7;
      pHVar3[iVar6].hi = dVar10;
      pHVar3[iVar6].lo =
           (dVar9 - (dVar7 + dVar10)) + (-dVar7 - (dVar10 - (dVar7 + dVar10))) + pHVar3[iVar6].lo;
    }
    else {
      piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar6;
      *piVar1 = *piVar1 + -1;
    }
    if (dVar8 < INFINITY) {
      dVar8 = dVar8 * in_XMM0_Qa;
      pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar3[iVar6].hi;
      dVar9 = dVar7 - dVar8;
      pHVar3[iVar6].hi = dVar9;
      pHVar3[iVar6].lo =
           (dVar7 - (dVar8 + dVar9)) + (-dVar8 - (dVar9 - (dVar8 + dVar9))) + pHVar3[iVar6].lo;
    }
    else {
      piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar6;
      *piVar1 = *piVar1 + -1;
    }
    if (-INFINITY < pdVar4[in_EDX]) {
      dVar8 = pdVar4[in_EDX] * in_XMM0_Qa;
      pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar7 = pHVar3[iVar6].hi;
      dVar9 = dVar7 - dVar8;
      pHVar3[iVar6].hi = dVar9;
      pHVar3[iVar6].lo =
           (dVar7 - (dVar8 + dVar9)) + (-dVar8 - (dVar9 - (dVar8 + dVar9))) + pHVar3[iVar6].lo;
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar6;
      *piVar1 = *piVar1 + -1;
    }
    if (INFINITY <= pdVar5[in_EDX]) {
      piVar2 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1 = piVar2 + iVar6;
      *piVar1 = *piVar1 + -1;
      return (int)piVar2;
    }
    dVar8 = pdVar5[in_EDX] * in_XMM0_Qa;
    pHVar3 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar7 = pHVar3[iVar6].hi;
    dVar9 = dVar7 - dVar8;
    pHVar3[iVar6].hi = dVar9;
    pHVar3[iVar6].lo =
         (dVar7 - (dVar8 + dVar9)) + (-dVar8 - (dVar9 - (dVar8 + dVar9))) + pHVar3[iVar6].lo;
    return (int)pHVar3;
  }
  if (dVar8 < INFINITY) {
    dVar8 = dVar8 * in_XMM0_Qa;
    pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar9 = pHVar3[iVar6].hi;
    dVar10 = dVar9 - dVar8;
    pHVar3[iVar6].hi = dVar10;
    pHVar3[iVar6].lo =
         (dVar9 - (dVar8 + dVar10)) + (-dVar8 - (dVar10 - (dVar8 + dVar10))) + pHVar3[iVar6].lo;
  }
  else {
    piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar6;
    *piVar1 = *piVar1 + -1;
  }
  if (-INFINITY < dVar7) {
    dVar7 = dVar7 * in_XMM0_Qa;
    pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar8 = pHVar3[iVar6].hi;
    dVar9 = dVar8 - dVar7;
    pHVar3[iVar6].hi = dVar9;
    pHVar3[iVar6].lo =
         (dVar8 - (dVar7 + dVar9)) + (-dVar7 - (dVar9 - (dVar7 + dVar9))) + pHVar3[iVar6].lo;
  }
  else {
    piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar6;
    *piVar1 = *piVar1 + -1;
  }
  if (pdVar5[in_EDX] < INFINITY) {
    dVar8 = pdVar5[in_EDX] * in_XMM0_Qa;
    pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar7 = pHVar3[iVar6].hi;
    dVar9 = dVar7 - dVar8;
    pHVar3[iVar6].hi = dVar9;
    pHVar3[iVar6].lo =
         (dVar7 - (dVar8 + dVar9)) + (-dVar8 - (dVar9 - (dVar8 + dVar9))) + pHVar3[iVar6].lo;
  }
  else {
    piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar6;
    *piVar1 = *piVar1 + -1;
  }
  if (pdVar4[in_EDX] <= -INFINITY) {
    piVar2 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1 = piVar2 + iVar6;
    *piVar1 = *piVar1 + -1;
    return (int)piVar2;
  }
  dVar8 = pdVar4[in_EDX] * in_XMM0_Qa;
  pHVar3 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar7 = pHVar3[iVar6].hi;
  dVar9 = dVar7 - dVar8;
  pHVar3[iVar6].hi = dVar9;
  pHVar3[iVar6].lo =
       (dVar7 - (dVar8 + dVar9)) + (-dVar8 - (dVar9 - (dVar8 + dVar9))) + pHVar3[iVar6].lo;
  return (int)pHVar3;
}

Assistant:

void HighsLinearSumBounds::remove(HighsInt sum, HighsInt var,
                                  double coefficient) {
  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);
  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    // coefficient is positive, therefore variable lower contributes to sum
    // lower bound
    if (vLower == -kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vLower * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vUpper * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varLower[var] * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varUpper[var] * coefficient;
  } else {
    // coefficient is negative, therefore variable upper contributes to sum
    // lower bound
    if (vUpper == kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= vUpper * coefficient;

    if (vLower == -kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= vLower * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= varUpper[var] * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= varLower[var] * coefficient;
  }
}